

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O2

void __thiscall OpenMD::StaticAnalyser::writeOutput(StaticAnalyser *this)

{
  pointer pOVar1;
  pointer ppAVar2;
  __uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
  _Var3;
  char cVar4;
  bool bVar5;
  ostream *poVar6;
  type_info *ptVar7;
  pointer pOVar8;
  uint uVar9;
  OutputData *data_1;
  OutputData *data;
  ulong uVar10;
  Revision r;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream ofs;
  undefined8 auStack_228 [63];
  
  std::ofstream::ofstream(&ofs,(this->outputFilename_)._M_dataplus._M_p,_S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    snprintf(painCave.errMsg,2000,"StaticAnalyser: unable to open %s\n",
             (this->outputFilename_)._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar6 = std::operator<<((ostream *)&ofs,"# ");
    poVar6 = std::operator<<(poVar6,(string *)&this->analysisType_);
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<((ostream *)&ofs,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&message,&r);
    poVar6 = std::operator<<(poVar6,(string *)&message);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)&message);
    poVar6 = std::operator<<((ostream *)&ofs,"# ");
    Revision::getBuildDate_abi_cxx11_(&message,&r);
    poVar6 = std::operator<<(poVar6,(string *)&message);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)&message);
    if ((this->paramString_)._M_string_length != 0) {
      poVar6 = std::operator<<((ostream *)&ofs,"# parameters: ");
      poVar6 = std::operator<<(poVar6,(string *)&this->paramString_);
      std::operator<<(poVar6,"\n");
    }
    std::operator<<((ostream *)&ofs,"#");
    pOVar1 = (this->data_).
             super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pOVar8 = (this->data_).
                  super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                  ._M_impl.super__Vector_impl_data._M_start; pOVar8 != pOVar1; pOVar8 = pOVar8 + 1)
    {
      if ((pOVar8->accumulator).
          super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pOVar8->accumulator).
          super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        poVar6 = std::operator<<((ostream *)&ofs,"\t");
        poVar6 = std::operator<<(poVar6,(string *)pOVar8);
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = std::operator<<(poVar6,(string *)&pOVar8->units);
        std::operator<<(poVar6,")");
        ptVar7 = (type_info *)
                 (**(code **)(*(long *)(((pOVar8->accumulator).
                                         super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                       ._M_t + 0x38))();
        bVar5 = std::type_info::operator==(ptVar7,(type_info *)&Vector3<double>::typeinfo);
        if (bVar5) {
          std::operator<<((ostream *)&ofs,"\t\t");
        }
        ptVar7 = (type_info *)
                 (**(code **)(*(long *)(((pOVar8->accumulator).
                                         super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                       ._M_t + 0x38))();
        bVar5 = std::type_info::operator==
                          (ptVar7,(type_info *)&std::vector<double,std::allocator<double>>::typeinfo
                          );
        if (bVar5) {
          std::operator<<((ostream *)&ofs,"(");
          uVar9 = 0;
          while( true ) {
            ppAVar2 = (this->outputTypes_).
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->outputTypes_).
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar2 >> 3) <=
                (ulong)uVar9) break;
            AtomType::getName_abi_cxx11_(&message,ppAVar2[uVar9]);
            poVar6 = std::operator<<((ostream *)&ofs,(string *)&message);
            std::operator<<(poVar6,"\t");
            std::__cxx11::string::~string((string *)&message);
            uVar9 = uVar9 + 1;
          }
          std::operator<<((ostream *)&ofs,")\t");
        }
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&ofs);
    *(undefined8 *)((long)auStack_228 + *(long *)(_ofs + -0x18)) = 8;
    for (uVar10 = 0; uVar10 < this->nBins_; uVar10 = uVar10 + 1) {
      pOVar1 = (this->data_).
               super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pOVar8 = (this->data_).
                    super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                    ._M_impl.super__Vector_impl_data._M_start; pOVar8 != pOVar1; pOVar8 = pOVar8 + 1
          ) {
        if ((pOVar8->accumulator).
            super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pOVar8->accumulator).
            super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+(&local_250,"StaticAnalyser detected a numerical error writing: ",
                         &pOVar8->title);
          std::operator+(&local_290,&local_250," for bin ");
          std::__cxx11::to_string(&local_270,(uint)uVar10);
          std::operator+(&message,&local_290,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_250);
          _Var3._M_t.
          super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
          .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl =
               (pOVar8->accumulator).
               super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_t.
               super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
               ._M_t;
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>.
                                _M_head_impl + 0x48))
                    (_Var3._M_t.
                     super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                     .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl,
                     &ofs,&message);
          std::__cxx11::string::~string((string *)&message);
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&ofs);
    }
    std::operator<<((ostream *)&ofs,"#######################################################\n");
    std::operator<<((ostream *)&ofs,"# 95% confidence intervals in those quantities follow:\n");
    std::operator<<((ostream *)&ofs,"#######################################################\n");
    for (uVar10 = 0; uVar10 < this->nBins_; uVar10 = uVar10 + 1) {
      std::operator<<((ostream *)&ofs,"#");
      pOVar1 = (this->data_).
               super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pOVar8 = (this->data_).
                    super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                    ._M_impl.super__Vector_impl_data._M_start; pOVar8 != pOVar1; pOVar8 = pOVar8 + 1
          ) {
        if ((pOVar8->accumulator).
            super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pOVar8->accumulator).
            super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+(&local_250,"StaticAnalyser detected a numerical error writing: ",
                         &pOVar8->title);
          std::operator+(&local_290,&local_250," std. dev. for bin ");
          std::__cxx11::to_string(&local_270,(uint)uVar10);
          std::operator+(&message,&local_290,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_250);
          _Var3._M_t.
          super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
          .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl =
               (pOVar8->accumulator).
               super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_t.
               super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
               ._M_t;
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>.
                                _M_head_impl + 0x50))
                    (_Var3._M_t.
                     super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                     .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl,
                     &ofs,&message,0);
          std::__cxx11::string::~string((string *)&message);
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&ofs);
    }
    std::ostream::flush();
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void StaticAnalyser::writeOutput() {
    std::ofstream ofs(outputFilename_.c_str());

    if (ofs.is_open()) {
      Revision r;
      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      // ofs << "# selection script1: \"" << selectionScript1_ ;
      // ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      // write title
      ofs << "#";
      for (const auto& data : data_) {
        if (!data.accumulator.empty()) {
          ofs << "\t" << data.title << "(" << data.units << ")";

          // add some extra tabs for column alignment
          if (data.accumulator[0]->getType() ==
              std::type_index(typeid(Vector3d))) {
            ofs << "\t\t";
          }

          if (data.accumulator[0]->getType() ==
              std::type_index(typeid(std::vector<RealType>))) {
            ofs << "(";
            for (unsigned int type = 0; type < outputTypes_.size(); type++) {
              ofs << outputTypes_[type]->getName() << "\t";
            }
            ofs << ")\t";
          }
        }
      }

      ofs << std::endl;

      ofs.precision(8);

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        for (const auto& data : data_) {
          if (!data.accumulator.empty()) {
            std::string message =
                "StaticAnalyser detected a numerical error writing: " +
                data.title + " for bin " + std::to_string(bin);

            data.accumulator[bin]->writeData(ofs, message, data.dataHandling);
          }
        }
        ofs << std::endl;
      }

      ofs << "#######################################################\n";
      ofs << "# 95% confidence intervals in those quantities follow:\n";
      ofs << "#######################################################\n";

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        ofs << "#";

        for (const auto& data : data_) {
          if (!data.accumulator.empty()) {
            std::string message =
                "StaticAnalyser detected a numerical error writing: " +
                data.title + " std. dev. for bin " + std::to_string(bin);

            data.accumulator[bin]->writeErrorBars(ofs, message);
          }
        }
        ofs << std::endl;
      }

      ofs.flush();
      ofs.close();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StaticAnalyser: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
  }